

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O3

void __thiscall chaiscript::AST_Node_Trace::AST_Node_Trace(AST_Node_Trace *this,AST_Node *node)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  File_Position FVar3;
  
  this->identifier = node->identifier;
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  pcVar1 = (node->text)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->text,pcVar1,pcVar1 + (node->text)._M_string_length);
  FVar3 = (node->location).end;
  (this->location).start = (node->location).start;
  (this->location).end = FVar3;
  (this->location).filename.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (node->location).filename.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var2 = (node->location).filename.
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->location).filename.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  get_children(&this->children,this,node);
  return;
}

Assistant:

AST_Node_Trace(const AST_Node &node)
        : identifier(node.identifier)
        , text(node.text)
        , location(node.location)
        , children(get_children(node)) {
    }